

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false>::
visit<slang::ast::InvalidTimingControl>
          (ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false> *this,
          InvalidTimingControl *t)

{
  bool bVar1;
  InvalidTimingControl *in_RSI;
  ASTVisitor<slang::ast::DriverVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = TimingControl::bad(&in_RSI->super_TimingControl);
  if (!bVar1) {
    visitDefault<slang::ast::InvalidTimingControl>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }